

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O3

void __thiscall LTAircraft::CalcCorrAngle(LTAircraft *this)

{
  double dVar1;
  double dVar2;
  vectorTy vecWind;
  vectorTy local_30;
  
  if (((this->super_Aircraft).bOnGrnd != false) || (this->phase == FPH_FLARE)) {
    MovingParam::moveTo(&this->corrAngle,0.0,NAN);
    return;
  }
  DataRefs::GetSimWind(&local_30,&dataRefs,(this->ppos)._alt);
  dVar1 = HeadingDiff((this->vec).angle,local_30.angle);
  if (dVar1 <= 90.0) {
    if (-90.0 <= dVar1) goto LAB_00155357;
    dVar2 = -180.0;
  }
  else {
    dVar2 = 180.0;
  }
  dVar1 = dVar2 - dVar1;
LAB_00155357:
  MovingParam::moveTo(&this->corrAngle,(dVar1 * local_30.speed) / (this->vec).speed,NAN);
  return;
}

Assistant:

void LTAircraft::CalcCorrAngle ()
{
    // correction only applies to flying before flare
    if (!IsOnGrnd() && phase != FPH_FLARE) {
        const vectorTy vecWind = dataRefs.GetSimWind(ppos.alt_m());
        double headDiff = HeadingDiff(vec.angle, vecWind.angle);
        if (headDiff > 90.0)                // if wind comes from behind only consider cross-wind component
            headDiff = 180.0 - headDiff;    // (so that if it comes straight from back (180deg) it would result in 0 correction
        else if (headDiff < -90.0)
            headDiff = -180.0 - headDiff;
        const double corr = headDiff * vecWind.speed / vec.speed;
        corrAngle.moveTo(corr);
    } else {
        // on the ground and while flare: no correction, or actually de-crab
        corrAngle.moveTo(0.0);
    }
}